

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void disconnect_cpu_mapping_from_gpu_object(cpu_mapping *cpu_mapping)

{
  cpu_mapping *pcVar1;
  cpu_mapping *local_28;
  cpu_mapping *prev;
  cpu_mapping *it;
  gpu_object *obj;
  cpu_mapping *cpu_mapping_local;
  
  local_28 = (cpu_mapping *)0x0;
  prev = cpu_mapping->object->cpu_mappings;
  while( true ) {
    if (prev == (cpu_mapping *)0x0) {
      fprintf(_stdout,"ERROR: can\'t find cpu_mapping on object\'s cpu_mappings list%s\n","");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      demmt_abort();
    }
    if (prev == cpu_mapping) break;
    local_28 = prev;
    prev = prev->next;
  }
  if (local_28 == (cpu_mapping *)0x0) {
    cpu_mapping->object->cpu_mappings = prev->next;
  }
  else {
    local_28->next = prev->next;
  }
  prev->next = (cpu_mapping *)0x0;
  cpu_mapping->object = (gpu_object *)0x0;
  cpu_mapping->object_offset = 0;
  cpu_mapping->data = (uint8_t *)0x0;
  pcVar1 = get_cpu_mapping(cpu_mapping->id);
  if (pcVar1 != cpu_mapping) {
    free(cpu_mapping);
  }
  return;
}

Assistant:

void disconnect_cpu_mapping_from_gpu_object(struct cpu_mapping *cpu_mapping)
{
	struct gpu_object *obj = cpu_mapping->object;
	struct cpu_mapping *it, *prev = NULL;
	for (it = obj->cpu_mappings; it != NULL; prev = it, it = it->next)
		if (it == cpu_mapping)
		{
			if (prev)
				prev->next = it->next;
			else
				obj->cpu_mappings = it->next;
			it->next = NULL;
			cpu_mapping->object = NULL;
			cpu_mapping->object_offset = 0;
			cpu_mapping->data = NULL;

			if (get_cpu_mapping(cpu_mapping->id) != cpu_mapping)
				free(cpu_mapping);

			return;
		}
	mmt_error("can't find cpu_mapping on object's cpu_mappings list%s\n", "");
	demmt_abort();
}